

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementBeamIGA::ChElementBeamIGA(ChElementBeamIGA *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  auVar4 = ZEXT816(0) << 0x40;
  auVar5 = ZEXT1632(auVar4);
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K =
       (ChMatrixDynamic<double>)auVar5._0_24_;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar5;
  (this->super_ChElementBeam).mass = 0.0;
  (this->super_ChElementBeam).length = 0.0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0xb5a940;
  this->super_ChLoadableU = (ChLoadableU)0xb5ab18;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb5ac00;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 )SUB3224(ZEXT1632(auVar4),0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT1632(auVar4),0x18);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  auVar6 = ZEXT464(0) << 0x40;
  this->Jacobian_s = (vector<double,_std::allocator<double>_>)auVar6._0_24_;
  this->Jacobian_b = (vector<double,_std::allocator<double>_>)auVar6._24_24_;
  (this->strain_e_0).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar6._48_8_;
  (this->strain_e_0).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar6._56_8_;
  *(undefined1 (*) [64])
   &(this->strain_e_0).
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = auVar6;
  *(undefined1 (*) [64])
   &(this->stress_m).
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = auVar6;
  this->plastic_data_old =
       (vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
        )auVar6._0_24_;
  this->plastic_data =
       (vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
        )auVar6._24_24_;
  this->section = (shared_ptr<chrono::fea::ChBeamSectionCosserat>)auVar6._48_16_;
  this->order = 3;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->nodes,4);
  if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 8) {
    pdVar3 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    if (pdVar3 != (double *)0x0) {
      free((void *)pdVar3[-1]);
    }
    pvVar1 = malloc(0x80);
    if (pvVar1 == (void *)0x0) {
      pdVar3 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x38) = pvVar1;
      pdVar3 = (double *)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar3 == (double *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar3;
  }
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 8;
  this->int_order_s = 1;
  this->int_order_b = 1;
  return;
}

Assistant:

ChElementBeamIGA::ChElementBeamIGA() {
    order = 3;
    nodes.resize(4);  // controllare se ordine = -> 2 nodi, 2 control points, o di pi?
    knots.resize(8);
    int_order_s = 1;
    int_order_b = 1;
}